

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.h
# Opt level: O3

void __thiscall
KDTree<YaoMST::PointPair,_2,_YaoMST::NewAt>::anyGreater
          (KDTree<YaoMST::PointPair,_2,_YaoMST::NewAt> *this,PointPair *pt,PointPair *l,PointPair *r
          )

{
  PointPair *pPVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  PointPair *pPVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  
  do {
    if (r < l || (long)r - (long)l == 0) {
      return;
    }
    pPVar1 = l + ((long)r - (long)l) / 0x50;
    pPVar5 = this->first;
    lVar8 = 0;
    bVar6 = true;
    do {
      bVar7 = bVar6;
      dVar2 = (&(pPVar1->nPoint).x)[lVar8];
      dVar3 = (&(pt->nPoint).x)[lVar8];
      if (dVar2 < dVar3) break;
      lVar8 = 1;
      bVar6 = false;
    } while (bVar7);
    if (dVar3 <= dVar2) {
      this->found = true;
      return;
    }
    anyGreater(this,pt,pPVar1 + 1,r);
    if (this->found != false) {
      return;
    }
    iVar4 = *(int *)((long)(this->split).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start +
                    ((long)pPVar1 - (long)pPVar5 >> 1) * -0x3333333333333333);
    r = pPVar1;
    if ((&(pPVar1->nPoint).x)[iVar4] < (&(pt->nPoint).x)[iVar4]) {
      return;
    }
  } while( true );
}

Assistant:

void anyGreater(const Point &pt, Point *l, Point *r)
	{
		if (l >= r) return;
		auto mid = l + (r - l) / 2;
		auto midIndex = mid - first;
		bool check = true;
		for (int d = 0; d < K && check; ++d)
			check &= coordinate(*mid, d) >= coordinate(pt, d);
		if (check)
			return void(found = true);
		anyGreater(pt, mid + 1, r);
		if (!found && coordinate(pt, split[midIndex]) <= coordinate(*mid, split[midIndex]))
			anyGreater(pt, l, mid);
	}